

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_SetReportIgnoresFalse_Test::
TestBody(MessageDifferencerTest_IgnoreField_SetReportIgnoresFalse_Test *this)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar1;
  bool bVar2;
  FieldDescriptor *pFVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_3e0;
  Message local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3a0;
  Message local_398;
  bool local_389;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  string diff_report;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  string local_188;
  FieldDescriptor *local_168;
  FieldDescriptor *rc;
  string local_158;
  FieldDescriptor *local_138;
  FieldDescriptor *c;
  string local_128;
  FieldDescriptor *local_108;
  FieldDescriptor *b;
  string local_f8;
  FieldDescriptor *local_d8;
  FieldDescriptor *a;
  undefined1 local_c0 [8];
  TestField msg2;
  TestField msg1;
  MessageDifferencerTest_IgnoreField_SetReportIgnoresFalse_Test *this_local;
  
  proto2_unittest::TestField::TestField((TestField *)((long)&msg2.field_0 + 0x40));
  proto2_unittest::TestField::TestField((TestField *)local_c0);
  proto2_unittest::TestField::set_a((TestField *)((long)&msg2.field_0 + 0x40),1);
  proto2_unittest::TestField::set_b((TestField *)((long)&msg2.field_0 + 0x40),2);
  proto2_unittest::TestField::set_c((TestField *)((long)&msg2.field_0 + 0x40),3);
  proto2_unittest::TestField::add_rc((TestField *)((long)&msg2.field_0 + 0x40),1);
  proto2_unittest::TestField::add_rc((TestField *)((long)&msg2.field_0 + 0x40),2);
  proto2_unittest::TestField::set_a((TestField *)local_c0,1);
  proto2_unittest::TestField::set_b((TestField *)local_c0,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"a",(allocator<char> *)((long)&b + 7));
  pFVar3 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0x40),&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 7));
  local_d8 = pFVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"b",(allocator<char> *)((long)&c + 7));
  pFVar3 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0x40),&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&c + 7));
  local_108 = pFVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"c",(allocator<char> *)((long)&rc + 7));
  pFVar3 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0x40),&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rc + 7));
  local_138 = pFVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"rc",
             (allocator<char> *)
             ((long)&fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pFVar3 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0x40),&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar1 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)((long)&diff_report.field_2 + 8);
  local_168 = pFVar3;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(pvVar1);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back(pvVar1,&local_d8);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)((long)&diff_report.field_2 + 8),&local_108);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)((long)&diff_report.field_2 + 8),&local_138);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)((long)&diff_report.field_2 + 8),&local_168);
  std::__cxx11::string::string((string *)&differencer.unpack_any_field_);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  util::MessageDifferencer::set_report_ignores((MessageDifferencer *)&gtest_ar_.message_,false);
  util::MessageDifferencer::set_report_matches((MessageDifferencer *)&gtest_ar_.message_,true);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)&gtest_ar_.message_,(string *)&differencer.unpack_any_field_);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)&gtest_ar_.message_,local_138);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)&gtest_ar_.message_,local_168);
  util::MessageDifferencer::set_scope((MessageDifferencer *)&gtest_ar_.message_,FULL);
  pvVar1 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)((long)&diff_report.field_2 + 8);
  bVar2 = util::MessageDifferencer::CompareWithFields
                    ((MessageDifferencer *)&gtest_ar_.message_,
                     (Message *)((long)&msg2.field_0 + 0x40),(Message *)local_c0,pvVar1,pvVar1);
  local_389 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_388,&local_389,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar2) {
    testing::Message::Message(&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_388,
               (AssertionResult *)"differencer.CompareWithFields(msg1, msg2, fields, fields)","true"
               ,"false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb33,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[36],_nullptr>
            ((EqHelper *)local_3d0,"diff_report","\"matched: a : 1\\n\" \"modified: b: 2 -> 1\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &differencer.unpack_any_field_,(char (*) [36])"matched: a : 1\nmodified: b: 2 -> 1\n");
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar2) {
    testing::Message::Message(&local_3d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb37,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&differencer.unpack_any_field_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)((long)&diff_report.field_2 + 8));
  proto2_unittest::TestField::~TestField((TestField *)local_c0);
  proto2_unittest::TestField::~TestField((TestField *)((long)&msg2.field_0 + 0x40));
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_SetReportIgnoresFalse) {
  proto2_unittest::TestField msg1;
  proto2_unittest::TestField msg2;

  msg1.set_a(1);
  msg1.set_b(2);
  msg1.set_c(3);
  msg1.add_rc(1);
  msg1.add_rc(2);

  msg2.set_a(1);
  msg2.set_b(1);

  const FieldDescriptor* a = GetFieldDescriptor(msg1, "a");
  const FieldDescriptor* b = GetFieldDescriptor(msg1, "b");
  const FieldDescriptor* c = GetFieldDescriptor(msg1, "c");
  const FieldDescriptor* rc = GetFieldDescriptor(msg1, "rc");

  std::vector<const FieldDescriptor*> fields;
  fields.push_back(a);
  fields.push_back(b);
  fields.push_back(c);
  fields.push_back(rc);

  std::string diff_report;
  util::MessageDifferencer differencer;
  differencer.set_report_ignores(false);
  differencer.set_report_matches(true);
  differencer.ReportDifferencesToString(&diff_report);
  differencer.IgnoreField(c);
  differencer.IgnoreField(rc);
  differencer.set_scope(util::MessageDifferencer::FULL);
  EXPECT_FALSE(differencer.CompareWithFields(msg1, msg2, fields, fields));

  EXPECT_EQ(diff_report,
            "matched: a : 1\n"
            "modified: b: 2 -> 1\n");
}